

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QMainWindowLayout::toggleToolBarsVisible(QMainWindowLayout *this)

{
  bool bVar1;
  QWidget *pQVar2;
  QPoint r_00;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  QRect QVar3;
  QRect r;
  QPoint topLeft;
  QRect *in_stack_ffffffffffffffb8;
  QLayout *in_stack_ffffffffffffffd0;
  QLayout *in_stack_ffffffffffffffe0;
  QToolBarAreaLayout *this_00;
  
  this_00 = *(QToolBarAreaLayout **)(in_FS_OFFSET + 0x28);
  *(byte *)&in_RDI[0x33].xp.m_i = ((byte)in_RDI[0x33].xp.m_i ^ 0xff) & 1;
  bVar1 = QWidget::isMaximized((QWidget *)in_RDI[0x13]);
  if (bVar1) {
    QLayout::update(in_stack_ffffffffffffffe0);
  }
  else {
    pQVar2 = QLayout::parentWidget(in_stack_ffffffffffffffd0);
    QWidget::geometry(pQVar2);
    r_00 = QRect::topLeft(in_stack_ffffffffffffffb8);
    pQVar2 = QLayout::parentWidget(in_stack_ffffffffffffffd0);
    QWidget::geometry(pQVar2);
    QVar3 = QToolBarAreaLayout::rectHint(this_00,(QRect *)r_00);
    QRect::moveTo((QRect *)QVar3._0_8_,in_RDI);
    QLayout::parentWidget(QVar3._0_8_);
    QWidget::setGeometry((QWidget *)this_00,(QRect *)r_00);
  }
  if (*(QToolBarAreaLayout **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayout::toggleToolBarsVisible()
{
    layoutState.toolBarAreaLayout.visible = !layoutState.toolBarAreaLayout.visible;
    if (!layoutState.mainWindow->isMaximized()) {
        QPoint topLeft = parentWidget()->geometry().topLeft();
        QRect r = parentWidget()->geometry();
        r = layoutState.toolBarAreaLayout.rectHint(r);
        r.moveTo(topLeft);
        parentWidget()->setGeometry(r);
    } else {
        update();
    }
}